

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgridlayout.cpp
# Opt level: O1

Orientations __thiscall
QGridLayoutPrivate::expandingDirections(QGridLayoutPrivate *this,int hSpacing,int vSpacing)

{
  QFlagsStorage<Qt::Orientation> QVar1;
  long lVar2;
  
  setupLayoutData(this,hSpacing,vSpacing);
  if (0 < (long)this->rr) {
    lVar2 = 0;
    do {
      if ((&((this->rowData).d.ptr)->expansive)[lVar2] == true) {
        QVar1.i = 2;
        goto LAB_002e728b;
      }
      lVar2 = lVar2 + 0x20;
    } while ((long)this->rr * 0x20 != lVar2);
  }
  QVar1.i = 0;
LAB_002e728b:
  if (0 < (long)this->cc) {
    lVar2 = 0;
    do {
      if ((&((this->colData).d.ptr)->expansive)[lVar2] == true) {
        return (Orientations)(QVar1.i | 1);
      }
      lVar2 = lVar2 + 0x20;
    } while ((long)this->cc * 0x20 != lVar2);
  }
  return (QFlagsStorageHelper<Qt::Orientation,_4>)(QFlagsStorageHelper<Qt::Orientation,_4>)QVar1.i;
}

Assistant:

Qt::Orientations QGridLayoutPrivate::expandingDirections(int hSpacing, int vSpacing) const
{
    QGridLayoutPrivate *that = const_cast<QGridLayoutPrivate*>(this);
    that->setupLayoutData(hSpacing, vSpacing);
    Qt::Orientations ret;

    for (int r = 0; r < rr; r++) {
        if (rowData.at(r).expansive) {
            ret |= Qt::Vertical;
            break;
        }
    }
    for (int c = 0; c < cc; c++) {
        if (colData.at(c).expansive) {
            ret |= Qt::Horizontal;
            break;
        }
    }
    return ret;
}